

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

void Eso_ManComputeOne(Eso_Man_t *p,Vec_Int_t *vEsop1,Vec_Int_t *vEsop2,Vec_Int_t *vEsop)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Hsh_VecMan_t *pHVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint Cube;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Vec_Int_t vCube1;
  Vec_Int_t vCube2;
  Vec_Int_t local_68;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t local_48;
  
  vEsop->nSize = 0;
  if (vEsop1->nSize != 0) {
    uVar1 = vEsop2->nSize;
    uVar9 = (ulong)uVar1;
    if (uVar1 != 0) {
      if ((0 < vEsop1->nSize) && (local_58 = vEsop, 0 < (int)uVar1)) {
        lVar10 = 0;
        local_50 = vEsop1;
        do {
          uVar1 = vEsop1->pArray[lVar10];
          if (uVar1 == p->Cube1) {
            if (0 < (int)uVar9) {
              lVar11 = 0;
              do {
                Eso_ManMinimizeAdd(p,vEsop2->pArray[lVar11]);
                lVar11 = lVar11 + 1;
                uVar9 = (ulong)vEsop2->nSize;
              } while (lVar11 < (long)uVar9);
            }
          }
          else if (0 < (int)uVar9) {
            lVar11 = 0;
            do {
              uVar2 = vEsop2->pArray[lVar11];
              Cube = uVar1;
              if (uVar2 == p->Cube1) {
LAB_006d981e:
                Eso_ManMinimizeAdd(p,Cube);
              }
              else {
                if ((int)uVar1 < 0) goto LAB_006d9875;
                pHVar5 = p->pHash;
                pVVar6 = pHVar5->vMap;
                if (pVVar6->nSize <= (int)uVar1) goto LAB_006d9875;
                iVar3 = pVVar6->pArray[uVar1];
                if (((long)iVar3 < 0) || (pVVar7 = pHVar5->vData, pVVar7->nSize <= iVar3)) {
LAB_006d9894:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                }
                piVar8 = pVVar7->pArray;
                iVar4 = piVar8[iVar3];
                (pHVar5->vTemp).nCap = iVar4;
                (pHVar5->vTemp).nSize = iVar4;
                (pHVar5->vTemp).pArray = piVar8 + iVar3 + 2;
                local_68.nCap = (pHVar5->vTemp).nCap;
                local_68.nSize = (pHVar5->vTemp).nSize;
                local_68.pArray = (pHVar5->vTemp).pArray;
                if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) goto LAB_006d9875;
                iVar3 = pVVar6->pArray[uVar2];
                if (((long)iVar3 < 0) || (pVVar7->nSize <= iVar3)) goto LAB_006d9894;
                piVar8 = pVVar7->pArray;
                iVar4 = piVar8[iVar3];
                (pHVar5->vTemp).nCap = iVar4;
                (pHVar5->vTemp).nSize = iVar4;
                (pHVar5->vTemp).pArray = piVar8 + iVar3 + 2;
                local_48.nCap = (pHVar5->vTemp).nCap;
                local_48.nSize = (pHVar5->vTemp).nSize;
                local_48.pArray = (pHVar5->vTemp).pArray;
                Cube = Eso_ManComputeAnd(p,&local_68,&local_48,p->vCube);
                if (-1 < (int)Cube) goto LAB_006d981e;
              }
              lVar11 = lVar11 + 1;
              uVar9 = (ulong)vEsop2->nSize;
              vEsop1 = local_50;
            } while (lVar11 < (long)uVar9);
          }
          lVar10 = lVar10 + 1;
          if (vEsop1->nSize <= lVar10) {
            Eso_ManMinimizeCopy(p,local_58);
            return;
          }
        } while( true );
      }
LAB_006d9875:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return;
}

Assistant:

void Eso_ManComputeOne( Eso_Man_t * p, Vec_Int_t * vEsop1, Vec_Int_t * vEsop2, Vec_Int_t * vEsop )
{
    Vec_Int_t vCube1, vCube2;
    int i, k, Cube1, Cube2, Cube;
    Vec_IntClear( vEsop );
    if ( Vec_IntSize(vEsop1) == 0 || Vec_IntSize(vEsop2) == 0 )
        return;
    Cube1 = Vec_IntEntry(vEsop1, 0);
    Cube2 = Vec_IntEntry(vEsop2, 0);
    Vec_IntForEachEntry( vEsop1, Cube1, i )
    {
        if ( Cube1 == p->Cube1 )
        {
            Vec_IntForEachEntry( vEsop2, Cube2, k )
                Eso_ManMinimizeAdd( p, Cube2 );
            continue;
        }
        Vec_IntForEachEntry( vEsop2, Cube2, k )
        {
            if ( Cube2 == p->Cube1 )
            {
                Eso_ManMinimizeAdd( p, Cube1 );
                continue;
            }
            vCube1 = *Hsh_VecReadEntry( p->pHash, Cube1 );
            vCube2 = *Hsh_VecReadEntry( p->pHash, Cube2 );
            Cube = Eso_ManComputeAnd( p, &vCube1, &vCube2, p->vCube );
            if ( Cube >= 0 )
                Eso_ManMinimizeAdd( p, Cube );
        }
    }
    Eso_ManMinimizeCopy( p, vEsop );
}